

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

bool ExecuteProblemSpace(shared_ptr<celero::ExperimentResult> *r)

{
  ExperimentResult *this;
  shared_ptr<celero::ExperimentResult> *psVar1;
  bool bVar2;
  bool bVar3;
  Experiment *pEVar4;
  uint64_t uVar5;
  ostream *poVar6;
  long lVar7;
  shared_ptr<celero::Factory> sVar8;
  _Head_base<0UL,_celero::Experiment::Impl_*,_false> local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  shared_ptr<celero::ExperimentResult> *local_c0;
  anon_class_16_1_54a39812 testRunner;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  string local_88;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_68;
  __shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2> *)&testRunner,
             &r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>);
  pEVar4 = celero::ExperimentResult::getExperiment
                     ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  uVar5 = celero::Experiment::getSamples(pEVar4);
  if (uVar5 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Celero Test \"");
    celero::ExperimentResult::getExperiment
              ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    celero::Experiment::getBenchmark((Experiment *)&local_d0);
    celero::Benchmark::getName_abi_cxx11_
              ((string *)&udmCollector,(Benchmark *)local_d0._M_head_impl);
    poVar6 = std::operator<<(poVar6,(string *)&udmCollector);
    poVar6 = std::operator<<(poVar6,"::");
    pEVar4 = celero::ExperimentResult::getExperiment
                       ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    celero::Experiment::getName_abi_cxx11_(&local_88,pEVar4);
    poVar6 = std::operator<<(poVar6,(string *)&local_88);
    poVar6 = std::operator<<(poVar6,"\" must have at least 1 sample.");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&udmCollector);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  }
  else {
    local_68.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar2 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()(&testRunner,false,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.
                super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (bVar2) {
      celero::ExperimentResult::getExperiment
                ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      sVar8 = celero::Experiment::getFactory((Experiment *)&local_d0);
      (**(code **)((long)((local_d0._M_head_impl)->results).
                         super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0x10))
                (&local_88,local_d0._M_head_impl,
                 sVar8.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      std::make_shared<celero::UserDefinedMeasurementCollector,std::shared_ptr<celero::TestFixture>>
                ((shared_ptr<celero::TestFixture> *)&udmCollector);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
      local_c0 = r;
      pEVar4 = celero::ExperimentResult::getExperiment
                         ((r->
                          super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      uVar5 = celero::Experiment::getSamples(pEVar4);
      lVar7 = uVar5 + 1;
      do {
        psVar1 = local_c0;
        lVar7 = lVar7 + -1;
        bVar2 = lVar7 == 0;
        if (bVar2) {
          this = (local_c0->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
          std::__shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_50,
                       &udmCollector.
                        super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                      );
          celero::ExperimentResult::setUserDefinedMeasurements
                    (this,(shared_ptr<celero::UserDefinedMeasurementCollector> *)&local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          celero::ExperimentResult::setComplete
                    ((psVar1->
                     super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,true);
          goto LAB_001371b2;
        }
        std::__shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_40,
                     &udmCollector.
                      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                    );
        bVar3 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()
                          (&testRunner,true,
                           (shared_ptr<celero::UserDefinedMeasurementCollector> *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      } while (bVar3);
      celero::ExperimentResult::setFailure
                ((local_c0->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr,true);
LAB_001371b2:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&udmCollector.
                  super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      goto LAB_001371bc;
    }
    celero::ExperimentResult::setFailure
              ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               true);
  }
  bVar2 = false;
LAB_001371bc:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&testRunner.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar2;
}

Assistant:

bool ExecuteProblemSpace(std::shared_ptr<celero::ExperimentResult> r)
{
	// Define a small internal function object to use to uniformly execute the tests.
	auto testRunner = [r](const bool record, std::shared_ptr<UserDefinedMeasurementCollector> udmCollector)
	{
		auto test = r->getExperiment()->getFactory()->Create();

		const auto runResult = RunAndCatchExc(*test, r->getExperiment()->getThreads(), r->getProblemSpaceIterations(), r->getProblemSpace());

		if(runResult.first == false)
		{
			// something bad happened
			return false;
		}

		const auto testTime = runResult.second;

		// Save test results
		if(record == true)
		{
			r->addRunTimeSample(testTime);
			r->addMemorySample(celero::GetRAMVirtualUsedByCurrentProcess());
			r->getExperiment()->incrementTotalRunTime(testTime);

			if(udmCollector != nullptr)
			{
				udmCollector->collect(test);
			}
		}

		return true;
	};

	if(r->getExperiment()->getSamples() > 0)
	{
		// make a first pass to maybe cache instructions/data or other kinds of fist-run-only costs
		if(testRunner(false, nullptr) == false)
		{
			r->setFailure(true);
			return false;
		}

		auto udmCollector = std::make_shared<UserDefinedMeasurementCollector>(r->getExperiment()->getFactory()->Create());

		for(auto i = r->getExperiment()->getSamples(); i > 0; --i)
		{
			if(testRunner(true, udmCollector) == false)
			{
				r->setFailure(true);
				return false;
			}
		}

		r->setUserDefinedMeasurements(udmCollector);
		r->setComplete(true);
	}
	else
	{
		std::cerr << "ERROR: Celero Test \"" << r->getExperiment()->getBenchmark()->getName() << "::" << r->getExperiment()->getName()
				  << "\" must have at least 1 sample." << std::endl;
		return false;
	}

	return true;
}